

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen-x86_64.c
# Opt level: O0

int pattern_match_p(gen_ctx_t gen_ctx,pattern *pat,MIR_insn_t insn,int try_short_jump_p)

{
  MIR_op_t *op;
  float fVar1;
  double dVar2;
  longdouble lVar3;
  int iVar4;
  int64_t v;
  uint64_t uVar5;
  size_t sVar6;
  size_t sVar7;
  MIR_insn_t pMVar8;
  bool bVar9;
  bool bVar10;
  long local_100;
  size_t n_1;
  int64_t disp;
  int s_p;
  int u_p;
  MIR_type_t type3;
  MIR_type_t type2;
  MIR_type_t type;
  uint64_t dec_val;
  int64_t n;
  MIR_reg_t hr;
  MIR_op_t *op_ref;
  MIR_op_t original;
  MIR_op_mode_t mode;
  char start_ch;
  char ch;
  char *p;
  size_t nops;
  size_t nop;
  MIR_context_t ctx;
  MIR_insn_t pMStack_28;
  int try_short_jump_p_local;
  MIR_insn_t insn_local;
  pattern *pat_local;
  gen_ctx_t gen_ctx_local;
  
  nop = (size_t)gen_ctx->ctx;
  ctx._4_4_ = try_short_jump_p;
  pMStack_28 = insn;
  insn_local = (MIR_insn_t)pat;
  pat_local = (pattern *)gen_ctx;
  p = (char *)MIR_insn_nops((MIR_context_t)nop,insn);
  nops = 0;
  _mode = (insn_local->insn_link).prev;
  do {
    if (*(char *)&_mode->data == '\0') {
      if ((char *)nops == p) {
        return 1;
      }
      __assert_fail("nop == nops",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                    ,0x831,"int pattern_match_p(gen_ctx_t, const struct pattern *, MIR_insn_t, int)"
                   );
    }
    while( true ) {
      bVar9 = true;
      if (*(char *)&_mode->data != ' ') {
        bVar9 = *(char *)&_mode->data == '\t';
      }
      if (!bVar9) break;
      _mode = (MIR_insn_t)((long)&_mode->data + 1);
    }
    if (*(char *)&_mode->data == '$') {
      return 1;
    }
    iVar4 = MIR_call_code_p((MIR_insn_code_t)*(undefined8 *)&pMStack_28->field_0x18);
    if ((iVar4 != 0) && (p <= nops)) {
      return 0;
    }
    if (p <= nops) {
      __assert_fail("nop < nops",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                    ,0x788,"int pattern_match_p(gen_ctx_t, const struct pattern *, MIR_insn_t, int)"
                   );
    }
    op = pMStack_28->ops + nops;
    original.u.mem.disp._6_1_ = *(undefined1 *)&_mode->data;
    switch(original.u.mem.disp._6_1_) {
    case 0x30:
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
      if (nops <= (ulong)(long)((char)original.u.mem.disp._6_1_ + -0x30)) {
        __assert_fail("n < nop",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                      ,0x80f,
                      "int pattern_match_p(gen_ctx_t, const struct pattern *, MIR_insn_t, int)");
      }
      memcpy(&op_ref,pMStack_28->ops + ((char)original.u.mem.disp._6_1_ + -0x30),0x30);
      original.u.mem.disp._0_4_ = ZEXT24(*(ushort *)&op->field_0x8 & 0xff);
      if (original.u.mem.disp._0_4_ == 4) {
        original.u.mem.disp._0_4_ = 3;
      }
      if (((uint)((ushort)original.data & 0xff) != original.u.mem.disp._0_4_) &&
         ((((ushort)original.data & 0xff) != 4 || (original.u.mem.disp._0_4_ != 3)))) {
        return 0;
      }
      if (((original.u.mem.disp._0_4_ != 2) && (original.u.mem.disp._0_4_ != 3)) &&
         ((original.u.mem.disp._0_4_ != 5 &&
          ((((original.u.mem.disp._0_4_ != 6 && (original.u.mem.disp._0_4_ != 7)) &&
            (original.u.mem.disp._0_4_ != 0xb)) && (original.u.mem.disp._0_4_ != 0xc)))))) {
        __assert_fail("mode == MIR_OP_VAR || mode == MIR_OP_INT || mode == MIR_OP_FLOAT || mode == MIR_OP_DOUBLE || mode == MIR_OP_LDOUBLE || mode == MIR_OP_VAR_MEM || mode == MIR_OP_LABEL"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                      ,0x817,
                      "int pattern_match_p(gen_ctx_t, const struct pattern *, MIR_insn_t, int)");
      }
      if ((original.u.mem.disp._0_4_ == 2) &&
         ((op->u).reg != CONCAT22(original._10_2_,CONCAT11(original._9_1_,original._8_1_)))) {
        return 0;
      }
      if ((original.u.mem.disp._0_4_ == 3) &&
         ((op->u).i !=
          CONCAT44(original._12_4_,CONCAT22(original._10_2_,CONCAT11(original._9_1_,original._8_1_))
                  ))) {
        return 0;
      }
      if ((original.u.mem.disp._0_4_ == 5) &&
         ((fVar1 = (float)CONCAT22(original._10_2_,CONCAT11(original._9_1_,original._8_1_)),
          (op->u).f != fVar1 || (NAN((op->u).f) || NAN(fVar1))))) {
        return 0;
      }
      if ((original.u.mem.disp._0_4_ == 6) &&
         ((dVar2 = (double)CONCAT44(original._12_4_,
                                    CONCAT22(original._10_2_,CONCAT11(original._9_1_,original._8_1_)
                                            )), (op->u).d != dVar2 || (NAN((op->u).d) || NAN(dVar2))
          ))) {
        return 0;
      }
      if ((original.u.mem.disp._0_4_ == 7) &&
         ((lVar3 = (longdouble)
                   CONCAT28(original.u.reg._0_2_,
                            CONCAT44(original._12_4_,
                                     CONCAT22(original._10_2_,
                                              CONCAT11(original._9_1_,original._8_1_)))),
          (op->u).ld != lVar3 || (NAN((op->u).ld) || NAN(lVar3))))) {
        return 0;
      }
      if ((original.u.mem.disp._0_4_ == 0xc) &&
         ((op->u).i !=
          CONCAT44(original._12_4_,CONCAT22(original._10_2_,CONCAT11(original._9_1_,original._8_1_))
                  ))) {
        return 0;
      }
      if ((original.u.mem.disp._0_4_ == 0xb) &&
         ((((*(char *)&op->u != original._8_1_ || ((op->u).mem.disp != original.u._16_8_)) ||
           ((op->u).mem.base != original.u.mem.nonalias)) ||
          (((op->u).mem.index != original.u.mem.nloc ||
           (((op->u).mem.index != 0xffffffff && ((op->u).mem.scale != original._9_1_)))))))) {
        return 0;
      }
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                    ,0x82e,"int pattern_match_p(gen_ctx_t, const struct pattern *, MIR_insn_t, int)"
                   );
    case 0x4c:
      break;
    case 0x58:
      break;
    case 99:
      _mode = (MIR_insn_t)((long)&_mode->data + 1);
      uVar5 = read_dec((char **)&mode);
      if ((((*(ushort *)&op->field_0x8 & 0xff) != 3) && ((*(ushort *)&op->field_0x8 & 0xff) != 4))
         || ((op->u).i != uVar5)) {
        return 0;
      }
      break;
    case 0x68:
      if ((*(ushort *)&op->field_0x8 & 0xff) != 2) {
        return 0;
      }
      original.u.mem.disp._7_1_ = *(char *)((long)&_mode->data + 1);
      if (((char)original.u.mem.disp._7_1_ < '0') || ('9' < (char)original.u.mem.disp._7_1_)) {
        _mode = (MIR_insn_t)((long)&_mode->data + 1);
        __assert_fail("\'0\' <= ch && ch <= \'9\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                      ,0x798,
                      "int pattern_match_p(gen_ctx_t, const struct pattern *, MIR_insn_t, int)");
      }
      n._4_4_ = (int)(char)original.u.mem.disp._7_1_ - 0x30;
      original.u.mem.disp._7_1_ = *(char *)((long)&_mode->data + 2);
      if (((char)original.u.mem.disp._7_1_ < '0') || ('9' < (char)original.u.mem.disp._7_1_)) {
        _mode = (MIR_insn_t)((long)&_mode->data + 1);
      }
      else {
        n._4_4_ = (n._4_4_ * 10 + (int)(char)original.u.mem.disp._7_1_) - 0x30;
        _mode = (MIR_insn_t)((long)&_mode->data + 2);
      }
      if ((op->u).reg != n._4_4_) {
        return 0;
      }
      break;
    case 0x69:
      if ((((*(ushort *)&op->field_0x8 & 0xff) != 3) && ((*(ushort *)&op->field_0x8 & 0xff) != 4))
         && ((*(ushort *)&op->field_0x8 & 0xff) != 8)) {
        return 0;
      }
      pMVar8 = (MIR_insn_t)((long)&_mode->data + 1);
      original.u.mem.disp._7_1_ = *(char *)((long)&_mode->data + 1);
      _mode = pMVar8;
      if (((char)original.u.mem.disp._7_1_ < '0') || ('3' < (char)original.u.mem.disp._7_1_)) {
        __assert_fail("\'0\' <= ch && ch <= \'3\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                      ,0x7a9,
                      "int pattern_match_p(gen_ctx_t, const struct pattern *, MIR_insn_t, int)");
      }
      v = int_value((gen_ctx_t)pat_local,op);
      if ((((original.u.mem.disp._7_1_ == '0') && (iVar4 = int8_p(v), iVar4 == 0)) ||
          ((original.u.mem.disp._7_1_ == '1' && (iVar4 = int16_p(v), iVar4 == 0)))) ||
         ((original.u.mem.disp._7_1_ == '2' && (iVar4 = int32_p(v), iVar4 == 0)))) {
        return 0;
      }
      break;
    case 0x6c:
      if ((*(ushort *)&op->field_0x8 & 0xff) != 0xc) {
        return 0;
      }
      if (ctx._4_4_ == 0) {
        return 0;
      }
      sVar6 = get_label_disp((gen_ctx_t)pat_local,(MIR_insn_t)(op->u).ref);
      sVar7 = VARR_uint8_tlength(*(VARR_uint8_t **)(*(long *)&pat_local[9].max_insn_size + 0x30));
      local_100 = sVar6 - sVar7;
      if (local_100 < 0) {
        local_100 = local_100 - (*(int *)&insn_local->field_0x18 + 4);
      }
      else {
        local_100 = local_100 + -2;
      }
      if ((local_100 < -0x80) || (0x7f < local_100)) {
        return 0;
      }
      break;
    case 0x6d:
      s_p = 0x13;
      bVar10 = true;
      bVar9 = true;
      pMVar8 = (MIR_insn_t)((long)&_mode->data + 1);
      original.u.mem.disp._7_1_ = *(char *)((long)&_mode->data + 1);
      switch(original.u.mem.disp._7_1_) {
      case 100:
        type3 = MIR_T_D;
        u_p = 0x13;
        _mode = pMVar8;
        break;
      case 0x66:
        type3 = MIR_T_F;
        u_p = 0x13;
        _mode = pMVar8;
        break;
      case 0x6c:
        pMVar8 = (MIR_insn_t)((long)&_mode->data + 2);
        original.u.mem.disp._7_1_ = *(char *)((long)&_mode->data + 2);
        _mode = pMVar8;
        if (original.u.mem.disp._7_1_ != 'd') {
          __assert_fail("ch == \'d\'",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                        ,0x7cd,
                        "int pattern_match_p(gen_ctx_t, const struct pattern *, MIR_insn_t, int)");
        }
        type3 = MIR_T_LD;
        u_p = 0x13;
        original.u.mem.disp._7_1_ = 100;
        break;
      case 0x73:
      case 0x75:
        bVar9 = original.u.mem.disp._7_1_ == 'u';
        bVar10 = original.u.mem.disp._7_1_ == 's';
        original.u.mem.disp._7_1_ = *(undefined1 *)((long)&_mode->data + 2);
        pMVar8 = (MIR_insn_t)((long)&_mode->data + 2);
      default:
        _mode = pMVar8;
        if (((char)original.u.mem.disp._7_1_ < '0') || ('3' < (char)original.u.mem.disp._7_1_)) {
          __assert_fail("\'0\' <= ch && ch <= \'3\'",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                        ,0x7d8,
                        "int pattern_match_p(gen_ctx_t, const struct pattern *, MIR_insn_t, int)");
        }
        if (original.u.mem.disp._7_1_ == '0') {
          type3 = (MIR_type_t)bVar9;
          u_p = 0x13;
          if (bVar9 && bVar10) {
            u_p = 0;
          }
        }
        else if (original.u.mem.disp._7_1_ == '1') {
          type3 = MIR_T_I16;
          if (bVar9) {
            type3 = MIR_T_U16;
          }
          u_p = 0x13;
          if (bVar9 && bVar10) {
            u_p = 2;
          }
        }
        else if (original.u.mem.disp._7_1_ == '2') {
          type3 = MIR_T_I32;
          if (bVar9) {
            type3 = MIR_T_U32;
          }
          u_p = 0x13;
          if (bVar9 && bVar10) {
            u_p = 4;
          }
        }
        else {
          type3 = MIR_T_I64;
          if (bVar9) {
            type3 = MIR_T_U64;
          }
          u_p = 0x13;
          if (bVar9 && bVar10) {
            u_p = 6;
          }
          s_p = 0xb;
        }
      }
      if (((type3 != MIR_T_LD) || ((*(ushort *)&op->field_0x8 & 0xff) != 2)) || ((op->u).reg < 0x22)
         ) {
        if ((*(ushort *)&op->field_0x8 & 0xff) != 0xb) {
          return 0;
        }
        if (((*(byte *)&op->u != type3) && ((uint)*(byte *)&op->u != u_p)) &&
           ((uint)*(byte *)&op->u != s_p)) {
          return 0;
        }
        if ((((op->u).mem.index != 0xffffffff) && ((op->u).mem.scale != '\x01')) &&
           (((op->u).mem.scale != '\x02' &&
            (((op->u).mem.scale != '\x04' && ((op->u).mem.scale != '\b')))))) {
          return 0;
        }
        iVar4 = int32_p((op->u).mem.disp);
        if (iVar4 == 0) {
          return 0;
        }
      }
      break;
    case 0x72:
      if ((*(ushort *)&op->field_0x8 & 0xff) != 2) {
        return 0;
      }
      break;
    case 0x73:
      if ((((*(ushort *)&op->field_0x8 & 0xff) != 3) && ((*(ushort *)&op->field_0x8 & 0xff) != 4))
         || (((op->u).i != 1 && ((((op->u).i != 2 && ((op->u).i != 4)) && ((op->u).i != 8)))))) {
        return 0;
      }
      break;
    case 0x74:
      if (((*(ushort *)&op->field_0x8 & 0xff) != 2) ||
         ((((op->u).reg != 0 && ((op->u).reg != 1)) && (((op->u).reg != 2 && ((op->u).reg != 3))))))
      {
        return 0;
      }
      break;
    case 0x7a:
      if ((((*(ushort *)&op->field_0x8 & 0xff) != 3) && ((*(ushort *)&op->field_0x8 & 0xff) != 4))
         || ((op->u).i != 0)) {
        return 0;
      }
    }
    _mode = (MIR_insn_t)((long)&_mode->data + 1);
    nops = nops + 1;
  } while( true );
}

Assistant:

static int pattern_match_p (gen_ctx_t gen_ctx, const struct pattern *pat, MIR_insn_t insn,
                            int try_short_jump_p) {
  MIR_context_t ctx = gen_ctx->ctx;
  size_t nop, nops = MIR_insn_nops (ctx, insn);
  const char *p;
  char ch, start_ch;
  MIR_op_mode_t mode;
  MIR_op_t original;
  const MIR_op_t *op_ref;
  MIR_reg_t hr;

  for (nop = 0, p = pat->pattern; *p != 0; p++, nop++) {
    while (*p == ' ' || *p == '\t') p++;
    if (*p == '$') return TRUE;
    if (MIR_call_code_p (insn->code) && nop >= nops) return FALSE;
    gen_assert (nop < nops);
    op_ref = &insn->ops[nop];
    switch (start_ch = *p) {
    case 'X': break;
    case 'r':
      if (op_ref->mode != MIR_OP_VAR) return FALSE;
      break;
    case 't':
      if (op_ref->mode != MIR_OP_VAR
          || !(AX_HARD_REG == op_ref->u.var || op_ref->u.var == CX_HARD_REG
               || op_ref->u.var == DX_HARD_REG || op_ref->u.var == BX_HARD_REG))
        return FALSE;
      break;
    case 'h':
      if (op_ref->mode != MIR_OP_VAR) return FALSE;
      ch = *++p;
      gen_assert ('0' <= ch && ch <= '9');
      hr = ch - '0';
      ch = *++p;
      if ('0' <= ch && ch <= '9')
        hr = hr * 10 + ch - '0';
      else
        --p;
      if (op_ref->u.var != hr) return FALSE;
      break;
    case 'z':
      if ((op_ref->mode != MIR_OP_INT && op_ref->mode != MIR_OP_UINT) || op_ref->u.i != 0)
        return FALSE;
      break;
    case 'i': {
      if (op_ref->mode != MIR_OP_INT && op_ref->mode != MIR_OP_UINT && op_ref->mode != MIR_OP_REF)
        return FALSE;
      ch = *++p;
      gen_assert ('0' <= ch && ch <= '3');
      int64_t n = int_value (gen_ctx, op_ref);
      if ((ch == '0' && !int8_p (n)) || (ch == '1' && !int16_p (n)) || (ch == '2' && !int32_p (n)))
        return FALSE;
      break;
    }
    case 's':
      if ((op_ref->mode != MIR_OP_INT && op_ref->mode != MIR_OP_UINT)
          || (op_ref->u.i != 1 && op_ref->u.i != 2 && op_ref->u.i != 4 && op_ref->u.i != 8))
        return FALSE;
      break;
    case 'c': {
      uint64_t dec_val;
      p++;
      dec_val = read_dec (&p);
      if ((op_ref->mode != MIR_OP_INT && op_ref->mode != MIR_OP_UINT) || op_ref->u.u != dec_val)
        return FALSE;
      break;
    }
    case 'm': {
      MIR_type_t type, type2, type3 = MIR_T_BOUND;
      int u_p, s_p;

      u_p = s_p = TRUE;
      ch = *++p;
      switch (ch) {
      case 'f':
        type = MIR_T_F;
        type2 = MIR_T_BOUND;
        break;
      case 'd':
        type = MIR_T_D;
        type2 = MIR_T_BOUND;
        break;
      case 'l':
        ch = *++p;
        gen_assert (ch == 'd');
        type = MIR_T_LD;
        type2 = MIR_T_BOUND;
        break;
      case 'u':
      case 's':
        u_p = ch == 'u';
        s_p = ch == 's';
        ch = *++p;
        /* falls through */
      default:
        gen_assert ('0' <= ch && ch <= '3');
        if (ch == '0') {
          type = u_p ? MIR_T_U8 : MIR_T_I8;
          type2 = u_p && s_p ? MIR_T_I8 : MIR_T_BOUND;
        } else if (ch == '1') {
          type = u_p ? MIR_T_U16 : MIR_T_I16;
          type2 = u_p && s_p ? MIR_T_I16 : MIR_T_BOUND;
        } else if (ch == '2') {
          type = u_p ? MIR_T_U32 : MIR_T_I32;
          type2 = u_p && s_p ? MIR_T_I32 : MIR_T_BOUND;
#if MIR_PTR32
          if (u_p) type3 = MIR_T_P;
#endif
        } else {
          type = u_p ? MIR_T_U64 : MIR_T_I64;
          type2 = u_p && s_p ? MIR_T_I64 : MIR_T_BOUND;
#if MIR_PTR64
          type3 = MIR_T_P;
#endif
        }
      }
      /* LD pseudos always get memory: */
      if (type == MIR_T_LD && op_ref->mode == MIR_OP_VAR && op_ref->u.var > MAX_HARD_REG) break;
      if (op_ref->mode != MIR_OP_VAR_MEM) return FALSE;
      if (op_ref->u.var_mem.type != type && op_ref->u.var_mem.type != type2
          && op_ref->u.var_mem.type != type3)
        return FALSE;
      if (op_ref->u.var_mem.index != MIR_NON_VAR && op_ref->u.var_mem.scale != 1
          && op_ref->u.var_mem.scale != 2 && op_ref->u.var_mem.scale != 4
          && op_ref->u.var_mem.scale != 8)
        return FALSE;
      if (!int32_p (op_ref->u.var_mem.disp)) return FALSE;
      break;
    }
    case 'L': break;
    case 'l':
      if (op_ref->mode != MIR_OP_LABEL) return FALSE;
      if (!try_short_jump_p) return FALSE; /* we are in size estimation mode */
      int64_t disp = ((int64_t) get_label_disp (gen_ctx, op_ref->u.label)
                      - (int64_t) VARR_LENGTH (uint8_t, result_code));
      /* short->long (+1 for long jump prefix +3 for offset), minimal jump is 2 bytes: */
      disp = disp < 0 ? disp - (pat->max_insn_size + 4) : disp - 2;
      if (-128 <= disp && disp < 128) break;
      return FALSE;
    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9': {
      size_t n = start_ch - '0';
      gen_assert (n < nop);
      original = insn->ops[n];
      mode = op_ref->mode;
      if (mode == MIR_OP_UINT) mode = MIR_OP_INT;
      if (original.mode != mode && (original.mode != MIR_OP_UINT || mode != MIR_OP_INT))
        return FALSE;
      gen_assert (mode == MIR_OP_VAR || mode == MIR_OP_INT || mode == MIR_OP_FLOAT
                  || mode == MIR_OP_DOUBLE || mode == MIR_OP_LDOUBLE || mode == MIR_OP_VAR_MEM
                  || mode == MIR_OP_LABEL);
      if (mode == MIR_OP_VAR && op_ref->u.var != original.u.var)
        return FALSE;
      else if (mode == MIR_OP_INT && op_ref->u.i != original.u.i)
        return FALSE;
      else if (mode == MIR_OP_FLOAT && op_ref->u.f != original.u.f)
        return FALSE;
      else if (mode == MIR_OP_DOUBLE && op_ref->u.d != original.u.d)
        return FALSE;
      else if (mode == MIR_OP_LDOUBLE && op_ref->u.ld != original.u.ld)
        return FALSE;
      else if (mode == MIR_OP_LABEL && op_ref->u.label != original.u.label)
        return FALSE;
      else if (mode == MIR_OP_VAR_MEM
               && (op_ref->u.var_mem.type != original.u.var_mem.type
                   || op_ref->u.var_mem.disp != original.u.var_mem.disp
                   || op_ref->u.var_mem.base != original.u.var_mem.base
                   || op_ref->u.var_mem.index != original.u.var_mem.index
                   || (op_ref->u.var_mem.index != MIR_NON_VAR
                       && op_ref->u.var_mem.scale != original.u.var_mem.scale)))
        return FALSE;
      break;
    }
    default: gen_assert (FALSE);
    }
  }
  gen_assert (nop == nops);
  return TRUE;
}